

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

int ft_black_new(FT_Memory memory,black_PRaster *araster)

{
  black_PRaster pbVar1;
  black_PRaster raster;
  black_PRaster *ppbStack_18;
  FT_Error error;
  black_PRaster *araster_local;
  FT_Memory memory_local;
  
  ppbStack_18 = araster;
  araster_local = (black_PRaster *)memory;
  pbVar1 = (black_PRaster)ft_mem_alloc(memory,8,(FT_Error *)((long)&raster + 4));
  if (raster._4_4_ == 0) {
    pbVar1->memory = araster_local;
  }
  *ppbStack_18 = pbVar1;
  return raster._4_4_;
}

Assistant:

static int
  ft_black_new( FT_Memory       memory,
                black_PRaster  *araster )
  {
    FT_Error       error;
    black_PRaster  raster = NULL;


    if ( !FT_NEW( raster ) )
      raster->memory = memory;

    *araster = raster;

    return error;
  }